

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void outerproduct(float32 **a,float32 *x,float32 *y,int32 len)

{
  int local_2c;
  int local_28;
  int32 j;
  int32 i;
  int32 len_local;
  float32 *y_local;
  float32 *x_local;
  float32 **a_local;
  
  for (local_28 = 0; local_28 < len; local_28 = local_28 + 1) {
    a[local_28][local_28] = (float32)((float)x[local_28] * (float)y[local_28]);
    local_2c = local_28;
    while (local_2c = local_2c + 1, local_2c < len) {
      a[local_28][local_2c] = (float32)((float)x[local_28] * (float)y[local_2c]);
      a[local_2c][local_28] = (float32)((float)x[local_2c] * (float)y[local_28]);
    }
  }
  return;
}

Assistant:

void
outerproduct(float32 ** a, float32 * x, float32 * y, int32 len)
{
    int32 i, j;

    for (i = 0; i < len; ++i) {
        a[i][i] = x[i] * y[i];
        for (j = i + 1; j < len; ++j) {
            a[i][j] = x[i] * y[j];
            a[j][i] = x[j] * y[i];
        }
    }
}